

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O0

void __thiscall pktalloc::Allocator::~Allocator(Allocator *this)

{
  uint uVar1;
  long lVar2;
  long in_RDI;
  WindowHeader *window_1;
  uint count_1;
  uint i_1;
  WindowHeader *window;
  uint count;
  uint i;
  long *in_stack_ffffffffffffff80;
  undefined4 local_4c;
  undefined4 local_3c;
  
  local_3c = 0;
  uVar1 = *(uint *)(in_RDI + 0xd0);
  for (; local_3c < uVar1; local_3c = local_3c + 1) {
    lVar2 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)(int)local_3c * 8);
    if ((lVar2 != 0) && ((*(byte *)(lVar2 + 0x10c) & 1) == 0)) {
      SIMDSafeFree(in_stack_ffffffffffffff80);
    }
  }
  local_4c = 0;
  uVar1 = *(uint *)(in_RDI + 0x1b0);
  for (; local_4c < uVar1; local_4c = local_4c + 1) {
    in_stack_ffffffffffffff80 = (long *)(*(long *)(in_RDI + 0x1b8) + (long)(int)local_4c * 8);
    if ((*in_stack_ffffffffffffff80 != 0) &&
       ((*(byte *)(*in_stack_ffffffffffffff80 + 0x10c) & 1) == 0)) {
      SIMDSafeFree(in_stack_ffffffffffffff80);
    }
  }
  SIMDSafeFree(in_stack_ffffffffffffff80);
  return;
}

Assistant:

Allocator::~Allocator()
{
    for (unsigned i = 0, count = PreferredWindows.GetSize(); i < count; ++i)
    {
        WindowHeader* window = PreferredWindows.GetRef(i);
        PKTALLOC_DEBUG_ASSERT(window != nullptr);
        if (window && !window->Preallocated) {
            SIMDSafeFree(window);
        }
    }
    for (unsigned i = 0, count = FullWindows.GetSize(); i < count; ++i)
    {
        WindowHeader* window = FullWindows.GetRef(i);
        PKTALLOC_DEBUG_ASSERT(window != nullptr);
        if (window && !window->Preallocated) {
            SIMDSafeFree(window);
        }
    }
    SIMDSafeFree(HugeChunkStart);
}